

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_logging.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
TestLoggingBind(ClientContext *context,TableFunctionBindInput *input,
               vector<duckdb::LogicalType,_true> *return_types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names)

{
  _Head_base<0UL,_duckdb::FunctionData_*,_false> in_RDI;
  unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>
  *in_stack_ffffffffffffffb8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> __args;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_ffffffffffffffd0;
  
  __args._M_head_impl = in_RDI._M_head_impl;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffffd0,(char (*) [6])in_RDI._M_head_impl);
  std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            (in_stack_ffffffffffffffd0,(LogicalTypeId *)__args._M_head_impl);
  duckdb::make_uniq<duckdb::TableFunctionData>();
  duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::TableFunctionData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_RDI._M_head_impl,in_stack_ffffffffffffffb8);
  duckdb::
  unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
               *)0x7121bf);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         __args._M_head_impl;
}

Assistant:

static duckdb::unique_ptr<FunctionData> TestLoggingBind(ClientContext &context, TableFunctionBindInput &input,
                                                        duckdb::vector<LogicalType> &return_types,
                                                        duckdb::vector<string> &names) {
	names.emplace_back("value");
	return_types.emplace_back(LogicalType::INTEGER);

	return make_uniq<TableFunctionData>();
}